

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureCube_GL.cpp
# Opt level: O3

void __thiscall
Diligent::TextureCube_GL::AttachToFramebuffer
          (TextureCube_GL *this,TextureViewDesc *ViewDesc,GLenum AttachmentPoint,
          FRAMEBUFFER_TARGET_FLAGS Targets)

{
  undefined4 in_register_0000000c;
  undefined1 *Args_1;
  GLenum GVar1;
  GLenum err;
  string msg;
  uint local_54;
  string local_50;
  
  Args_1 = (undefined1 *)CONCAT44(in_register_0000000c,Targets);
  if ((ViewDesc->field_6).NumArraySlices ==
      (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
      super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
      .m_Desc.field_3.ArraySize) {
    if ((Targets & FRAMEBUFFER_TARGET_FLAG_DRAW) != FRAMEBUFFER_TARGET_FLAG_NONE) {
      if ((ViewDesc->ViewType & ~TEXTURE_VIEW_SHADER_RESOURCE) != TEXTURE_VIEW_RENDER_TARGET) {
        FormatString<char[26],char[99]>
                  (&local_50,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL"
                   ,(char (*) [99])Args_1);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                   ,0x104);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      (*__glewFramebufferTexture)
                (0x8ca9,AttachmentPoint,(this->super_TextureBaseGL).m_GlTexture.m_uiHandle,
                 ViewDesc->MostDetailedMip);
      local_54 = glGetError();
      if (local_54 != 0) {
        LogError<false,char[50],char[17],unsigned_int>
                  (false,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                   ,0x106,(char (*) [50])"Failed to attach texture cube to draw framebuffer",
                   (char (*) [17])"\nGL Error Code: ",&local_54);
        FormatString<char[6]>(&local_50,(char (*) [6])0x32e52e);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                   ,0x106);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((Targets & FRAMEBUFFER_TARGET_FLAG_READ) == FRAMEBUFFER_TARGET_FLAG_NONE) {
      return;
    }
    (*__glewFramebufferTexture)
              (0x8ca8,AttachmentPoint,(this->super_TextureBaseGL).m_GlTexture.m_uiHandle,
               ViewDesc->MostDetailedMip);
    local_54 = glGetError();
    if (local_54 == 0) {
      return;
    }
    LogError<false,char[50],char[17],unsigned_int>
              (false,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
               ,0x10b,(char (*) [50])"Failed to attach texture cube to read framebuffer",
               (char (*) [17])"\nGL Error Code: ",&local_54);
    FormatString<char[6]>(&local_50,(char (*) [6])0x32e52e);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
               ,0x10b);
  }
  else if ((ViewDesc->field_6).NumArraySlices == 1) {
    GVar1 = 0;
    if ((ulong)(ViewDesc->field_5).FirstArraySlice < 6) {
      Args_1 = GetCubeMapFaceBindTarget(unsigned_int)::CubeMapFaceTargets;
      GVar1 = *(GLenum *)
               (GetCubeMapFaceBindTarget(unsigned_int)::CubeMapFaceTargets +
               (ulong)(ViewDesc->field_5).FirstArraySlice * 4);
    }
    if ((Targets & FRAMEBUFFER_TARGET_FLAG_DRAW) != FRAMEBUFFER_TARGET_FLAG_NONE) {
      if ((ViewDesc->ViewType & ~TEXTURE_VIEW_SHADER_RESOURCE) != TEXTURE_VIEW_RENDER_TARGET) {
        FormatString<char[26],char[99]>
                  (&local_50,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL"
                   ,(char (*) [99])Args_1);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                   ,0x11a);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      (*__glewFramebufferTexture2D)
                (0x8ca9,AttachmentPoint,GVar1,(this->super_TextureBaseGL).m_GlTexture.m_uiHandle,
                 ViewDesc->MostDetailedMip);
      local_54 = glGetError();
      if (local_54 != 0) {
        LogError<false,char[55],char[17],unsigned_int>
                  (false,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                   ,0x11c,(char (*) [55])"Failed to attach texture cube face to draw framebuffer",
                   (char (*) [17])"\nGL Error Code: ",&local_54);
        FormatString<char[6]>(&local_50,(char (*) [6])0x32e52e);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                   ,0x11c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((Targets & FRAMEBUFFER_TARGET_FLAG_READ) == FRAMEBUFFER_TARGET_FLAG_NONE) {
      return;
    }
    (*__glewFramebufferTexture2D)
              (0x8ca8,AttachmentPoint,GVar1,(this->super_TextureBaseGL).m_GlTexture.m_uiHandle,
               ViewDesc->MostDetailedMip);
    local_54 = glGetError();
    if (local_54 == 0) {
      return;
    }
    LogError<false,char[55],char[17],unsigned_int>
              (false,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
               ,0x121,(char (*) [55])"Failed to attach texture cube face to read framebuffer",
               (char (*) [17])"\nGL Error Code: ",&local_54);
    FormatString<char[6]>(&local_50,(char (*) [6])0x32e52e);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
               ,0x121);
  }
  else {
    FormatString<char[70]>
              (&local_50,
               (char (*) [70])
               "Only one slice or the entire cubemap can be attached to a framebuffer");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
               ,0x126);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TextureCube_GL::AttachToFramebuffer(const TextureViewDesc& ViewDesc, GLenum AttachmentPoint, FRAMEBUFFER_TARGET_FLAGS Targets)
{
    if (ViewDesc.NumArraySlices == m_Desc.ArraySize)
    {
        if (Targets & FRAMEBUFFER_TARGET_FLAG_DRAW)
        {
            VERIFY_EXPR(ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL);
            glFramebufferTexture(GL_DRAW_FRAMEBUFFER, AttachmentPoint, m_GlTexture, ViewDesc.MostDetailedMip);
            DEV_CHECK_GL_ERROR("Failed to attach texture cube to draw framebuffer");
        }
        if (Targets & FRAMEBUFFER_TARGET_FLAG_READ)
        {
            glFramebufferTexture(GL_READ_FRAMEBUFFER, AttachmentPoint, m_GlTexture, ViewDesc.MostDetailedMip);
            DEV_CHECK_GL_ERROR("Failed to attach texture cube to read framebuffer");
        }
    }
    else if (ViewDesc.NumArraySlices == 1)
    {
        // Texture name must either be zero or the name of an existing 3D texture, 1D or 2D array texture,
        // cube map array texture, or multisample array texture.

        auto CubeMapFaceBindTarget = GetCubeMapFaceBindTarget(ViewDesc.FirstArraySlice);
        // For glFramebufferTexture2D, if texture is not zero, textarget must be one of GL_TEXTURE_2D, GL_TEXTURE_RECTANGLE,
        // GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_CUBE_MAP_POSITIVE_Y, GL_TEXTURE_CUBE_MAP_POSITIVE_Z,
        // GL_TEXTURE_CUBE_MAP_NEGATIVE_X, GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, GL_TEXTURE_CUBE_MAP_NEGATIVE_Z,
        // or GL_TEXTURE_2D_MULTISAMPLE.
        if (Targets & FRAMEBUFFER_TARGET_FLAG_DRAW)
        {
            VERIFY_EXPR(ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL);
            glFramebufferTexture2D(GL_DRAW_FRAMEBUFFER, AttachmentPoint, CubeMapFaceBindTarget, m_GlTexture, ViewDesc.MostDetailedMip);
            DEV_CHECK_GL_ERROR("Failed to attach texture cube face to draw framebuffer");
        }
        if (Targets & FRAMEBUFFER_TARGET_FLAG_READ)
        {
            glFramebufferTexture2D(GL_READ_FRAMEBUFFER, AttachmentPoint, CubeMapFaceBindTarget, m_GlTexture, ViewDesc.MostDetailedMip);
            DEV_CHECK_GL_ERROR("Failed to attach texture cube face to read framebuffer");
        }
    }
    else
    {
        UNEXPECTED("Only one slice or the entire cubemap can be attached to a framebuffer");
    }
}